

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

void object_origin_combine(object *obj1,object *obj2)

{
  _Bool local_1c;
  _Bool local_1b;
  _Bool uniq2;
  _Bool uniq1;
  object *obj2_local;
  object *obj1_local;
  
  if (obj1->origin_race == obj2->origin_race) {
    if ((obj1->origin != obj2->origin) || (obj1->origin_depth != obj2->origin_depth)) {
      obj1->origin = '\t';
    }
  }
  else {
    local_1b = false;
    if (obj1->origin_race != (monster_race *)0x0) {
      local_1b = flag_has_dbg(obj1->origin_race->flags,0xc,1,"obj1->origin_race->flags","RF_UNIQUE")
      ;
    }
    local_1c = false;
    if (obj2->origin_race != (monster_race *)0x0) {
      local_1c = flag_has_dbg(obj2->origin_race->flags,0xc,1,"obj2->origin_race->flags","RF_UNIQUE")
      ;
    }
    if ((local_1b == false) || (local_1c != false)) {
      if ((local_1c == false) || (local_1b != false)) {
        obj1->origin = '\t';
      }
      else {
        obj1->origin = obj2->origin;
        obj1->origin_depth = obj2->origin_depth;
        obj1->origin_place = obj2->origin_place;
        obj1->origin_race = obj2->origin_race;
      }
    }
  }
  return;
}

Assistant:

void object_origin_combine(struct object *obj1, const struct object *obj2)
{
	if (obj1->origin_race != obj2->origin_race) {
		bool uniq1 = (obj1->origin_race
			&& rf_has(obj1->origin_race->flags, RF_UNIQUE));
		bool uniq2 = (obj2->origin_race
			&& rf_has(obj2->origin_race->flags, RF_UNIQUE));

		if (uniq1 && !uniq2) {
			/* Favour keeping record for a unique */
			;
		} else if (uniq2 && !uniq1) {
			/* Favour keeping record for a unique */
			obj1->origin = obj2->origin;
			obj1->origin_depth = obj2->origin_depth;
			obj1->origin_place = obj2->origin_place;
			obj1->origin_race = obj2->origin_race;
		} else {
			/* Different monsters, neither or both unique, mixed origin */
			obj1->origin = ORIGIN_MIXED;
		}
	} else if (obj1->origin != obj2->origin
			|| obj1->origin_depth != obj2->origin_depth) {
		obj1->origin = ORIGIN_MIXED;
	}
}